

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_schnorrsig_sign_internal
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_nonce_function_hardened noncefp,void *ndata)

{
  int iVar1;
  uint uVar2;
  long in_RCX;
  long in_RDX;
  void *in_RSI;
  secp256k1_context *in_RDI;
  long in_R8;
  code *in_R9;
  uchar *in_stack_00000008;
  int ret;
  uchar seckey [32];
  uchar pk_buf [32];
  uchar buf [32];
  secp256k1_ge r;
  secp256k1_ge pk;
  secp256k1_gej rj;
  secp256k1_scalar k;
  secp256k1_scalar e;
  secp256k1_scalar sk;
  secp256k1_fe *in_stack_fffffffffffffdc8;
  secp256k1_fe *a;
  secp256k1_callback *in_stack_fffffffffffffdd0;
  uchar *r_00;
  secp256k1_keypair *in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 uVar3;
  uint uVar4;
  secp256k1_scalar *in_stack_fffffffffffffde8;
  secp256k1_context *in_stack_fffffffffffffdf0;
  undefined1 local_1f8 [32];
  secp256k1_gej *in_stack_fffffffffffffe28;
  secp256k1_ge *in_stack_fffffffffffffe30;
  uchar *in_stack_fffffffffffffe50;
  size_t in_stack_fffffffffffffe58;
  uchar *in_stack_fffffffffffffe60;
  uchar *in_stack_fffffffffffffe68;
  secp256k1_scalar *in_stack_fffffffffffffe70;
  secp256k1_scalar *in_stack_fffffffffffffe90;
  secp256k1_gej *in_stack_fffffffffffffe98;
  secp256k1_ecmult_gen_context *in_stack_fffffffffffffea0;
  secp256k1_scalar local_44;
  secp256k1_scalar local_40;
  secp256k1_scalar local_3c;
  code *local_38;
  long local_30;
  long local_28;
  long local_20;
  void *local_18;
  secp256k1_context *local_10;
  uint local_4;
  
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(&stack0xfffffffffffffe28,0,0x20);
  uVar4 = 1;
  if (local_10 == (secp256k1_context *)0x0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/schnorrsig/main_impl.h"
            ,0x90,"test condition failed: ctx != NULL");
    abort();
  }
  iVar1 = secp256k1_ecmult_gen_context_is_built(&local_10->ecmult_gen_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    local_4 = 0;
  }
  else if (local_18 == (void *)0x0) {
    secp256k1_callback_call(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
    local_4 = 0;
  }
  else {
    uVar3 = CONCAT13(1,(int3)in_stack_fffffffffffffde0);
    if (local_20 == 0) {
      uVar3 = CONCAT13(local_28 == 0,(int3)in_stack_fffffffffffffde0);
    }
    if ((((byte)((uint)uVar3 >> 0x18) ^ 0xff) & 1) == 0) {
      if (local_30 == 0) {
        secp256k1_callback_call(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
        local_4 = 0;
      }
      else {
        if (local_38 == (code *)0x0) {
          local_38 = nonce_function_bip340;
        }
        uVar2 = secp256k1_keypair_load
                          (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                           (secp256k1_ge *)CONCAT44(uVar4,uVar3),in_stack_fffffffffffffdd8);
        uVar2 = uVar2 & uVar4;
        iVar1 = secp256k1_fe_is_odd((secp256k1_fe *)0x109297);
        if (iVar1 != 0) {
          secp256k1_scalar_negate(&local_3c,&local_3c);
        }
        secp256k1_scalar_get_b32
                  ((uchar *)in_stack_fffffffffffffdd0,(secp256k1_scalar *)in_stack_fffffffffffffdc8)
        ;
        secp256k1_fe_get_b32((uchar *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
        a = (secp256k1_fe *)0xd;
        iVar1 = (*local_38)(&stack0xfffffffffffffe28,local_20,local_28,&stack0xfffffffffffffde8,
                            local_1f8,"BIP0340/nonce");
        uVar2 = iVar1 != 0 & uVar2;
        secp256k1_scalar_set_b32(&local_44,&stack0xfffffffffffffe28,(int *)0x0);
        iVar1 = secp256k1_scalar_is_zero(&local_44);
        uVar2 = ((iVar1 != 0 ^ 0xffU) & 1) & uVar2;
        secp256k1_scalar_cmov(&local_44,&secp256k1_scalar_one,(uint)((uVar2 != 0 ^ 0xffU) & 1));
        secp256k1_ecmult_gen
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        secp256k1_ge_set_gej(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
        secp256k1_declassify(local_10,&stack0xfffffffffffffe50,0x68);
        secp256k1_fe_normalize_var((secp256k1_fe *)0x1093e4);
        iVar1 = secp256k1_fe_is_odd((secp256k1_fe *)0x1093f5);
        r_00 = in_stack_00000008;
        if (iVar1 != 0) {
          secp256k1_scalar_negate(&local_44,&local_44);
          r_00 = in_stack_00000008;
        }
        secp256k1_fe_normalize_var((secp256k1_fe *)0x109417);
        secp256k1_fe_get_b32(r_00,a);
        secp256k1_schnorrsig_challenge
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                   in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
        secp256k1_scalar_mul(&local_40,&local_40,&local_3c);
        secp256k1_scalar_add(&local_40,&local_40,&local_44);
        secp256k1_scalar_get_b32(r_00,(secp256k1_scalar *)a);
        secp256k1_memczero(local_18,0x40,(uint)((uVar2 != 0 ^ 0xffU) & 1));
        secp256k1_scalar_clear(&local_44);
        secp256k1_scalar_clear(&local_3c);
        memset(&stack0xfffffffffffffde8,0,0x20);
        local_4 = uVar2;
      }
    }
    else {
      secp256k1_callback_call(in_stack_fffffffffffffdd0,(char *)in_stack_fffffffffffffdc8);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int secp256k1_schnorrsig_sign_internal(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_nonce_function_hardened noncefp, void *ndata) {
    secp256k1_scalar sk;
    secp256k1_scalar e;
    secp256k1_scalar k;
    secp256k1_gej rj;
    secp256k1_ge pk;
    secp256k1_ge r;
    unsigned char buf[32] = { 0 };
    unsigned char pk_buf[32];
    unsigned char seckey[32];
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(sig64 != NULL);
    ARG_CHECK(msg != NULL || msglen == 0);
    ARG_CHECK(keypair != NULL);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_bip340;
    }

    ret &= secp256k1_keypair_load(ctx, &sk, &pk, keypair);
    /* Because we are signing for a x-only pubkey, the secret key is negated
     * before signing if the point corresponding to the secret key does not
     * have an even Y. */
    if (secp256k1_fe_is_odd(&pk.y)) {
        secp256k1_scalar_negate(&sk, &sk);
    }

    secp256k1_scalar_get_b32(seckey, &sk);
    secp256k1_fe_get_b32(pk_buf, &pk.x);
    ret &= !!noncefp(buf, msg, msglen, seckey, pk_buf, bip340_algo, sizeof(bip340_algo), ndata);
    secp256k1_scalar_set_b32(&k, buf, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rj, &k);
    secp256k1_ge_set_gej(&r, &rj);

    /* We declassify r to allow using it as a branch point. This is fine
     * because r is not a secret. */
    secp256k1_declassify(ctx, &r, sizeof(r));
    secp256k1_fe_normalize_var(&r.y);
    if (secp256k1_fe_is_odd(&r.y)) {
        secp256k1_scalar_negate(&k, &k);
    }
    secp256k1_fe_normalize_var(&r.x);
    secp256k1_fe_get_b32(&sig64[0], &r.x);

    secp256k1_schnorrsig_challenge(&e, &sig64[0], msg, msglen, pk_buf);
    secp256k1_scalar_mul(&e, &e, &sk);
    secp256k1_scalar_add(&e, &e, &k);
    secp256k1_scalar_get_b32(&sig64[32], &e);

    secp256k1_memczero(sig64, 64, !ret);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);
    memset(seckey, 0, sizeof(seckey));

    return ret;
}